

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZone::getDisplayName
          (TimeZone *this,UBool daylight,EDisplayType style,Locale *locale,UnicodeString *result)

{
  ushort uVar1;
  UErrorCode UVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  TimeZoneFormat *pTVar6;
  TimeZoneNames *pTVar7;
  UChar *text;
  undefined7 in_register_00000031;
  uint uVar8;
  ushort uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  UErrorCode status;
  TimeZoneNames *local_88;
  undefined4 local_80;
  UTimeZoneFormatTimeType timeType;
  UDate local_78;
  UnicodeString canonicalID;
  
  status = U_ZERO_ERROR;
  local_78 = Calendar::getNow();
  timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  uVar10 = (undefined4)CONCAT71(in_register_00000031,daylight);
  if ((style < (GENERIC_LOCATION|SHORT)) && ((0x118U >> (style & 0x1f) & 1) != 0)) {
    uVar11 = 2;
    local_80 = uVar10;
    pTVar6 = TimeZoneFormat::createInstance(locale,&status);
    local_88 = (TimeZoneNames *)CONCAT44(local_88._4_4_,status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (style == SHORT_GENERIC) {
LAB_001f89ae:
        (*(pTVar6->super_Format).super_UObject._vptr_UObject[8])
                  (local_78,pTVar6,uVar11,this,result,&timeType);
      }
      else {
        if (style == GENERIC_LOCATION) {
          uVar11 = 0;
          goto LAB_001f89ae;
        }
        if (style == LONG_GENERIC) {
          uVar11 = 1;
          goto LAB_001f89ae;
        }
      }
      if ((char)local_80 == '\0' || timeType != UTZFMT_TIME_TYPE_STANDARD) {
        if ((char)local_80 != '\0' || timeType != UTZFMT_TIME_TYPE_DAYLIGHT) goto LAB_001f88c7;
        iVar5 = (*(this->super_UObject)._vptr_UObject[8])(this);
      }
      else {
        iVar3 = (*(this->super_UObject)._vptr_UObject[8])(this);
        iVar4 = (*(this->super_UObject)._vptr_UObject[0xd])(this);
        iVar5 = iVar4 + iVar3;
      }
      if (style == SHORT_GENERIC) {
        TimeZoneFormat::formatOffsetShortLocalizedGMT(pTVar6,iVar5,result,&status);
      }
      else {
        TimeZoneFormat::formatOffsetLocalizedGMT(pTVar6,iVar5,result,&status);
      }
    }
    else {
      uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
      uVar9 = 2;
      if ((uVar1 & 1) == 0) {
        uVar9 = uVar1 & 0x1e;
      }
      (result->fUnion).fStackFields.fLengthAndFlags = uVar9;
    }
  }
  else {
    if (1 < style - SHORT_GMT) {
      if ((style == SHORT) || (style == SHORT_COMMONLY_USED)) {
        uVar8 = (uint)(daylight != '\0') * 0x10 + 0x10;
      }
      else {
        uVar8 = 0;
        if (style == LONG) {
          uVar8 = (uint)(daylight != '\0') * 2 + 2;
        }
      }
      local_80 = uVar10;
      pTVar7 = TimeZoneNames::createInstance(locale,&status);
      UVar2 = status;
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_88 = pTVar7;
        text = ZoneMeta::getCanonicalCLDRID(this);
        UnicodeString::UnicodeString(&canonicalID,text);
        (*(local_88->super_UObject)._vptr_UObject[0xc])
                  (local_78,local_88,&canonicalID,(ulong)uVar8,result);
        if ((ushort)(result->fUnion).fStackFields.fLengthAndFlags < 0x20) {
          pTVar6 = TimeZoneFormat::createInstance(locale,&status);
          if (((char)local_80 == '\0') ||
             (iVar3 = (*(this->super_UObject)._vptr_UObject[9])(this), (char)iVar3 == '\0')) {
            iVar5 = (*(this->super_UObject)._vptr_UObject[8])(this);
          }
          else {
            iVar3 = (*(this->super_UObject)._vptr_UObject[8])(this);
            iVar4 = (*(this->super_UObject)._vptr_UObject[0xd])();
            iVar5 = iVar4 + iVar3;
          }
          if (style == LONG) {
            TimeZoneFormat::formatOffsetLocalizedGMT(pTVar6,iVar5,result,&status);
          }
          else {
            TimeZoneFormat::formatOffsetShortLocalizedGMT(pTVar6,iVar5,result,&status);
          }
          if (pTVar6 != (TimeZoneFormat *)0x0) {
            (*(pTVar6->super_Format).super_UObject._vptr_UObject[1])(pTVar6);
          }
        }
        UnicodeString::~UnicodeString(&canonicalID);
        pTVar7 = local_88;
      }
      else {
        uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
        uVar9 = 2;
        if ((uVar1 & 1) == 0) {
          uVar9 = uVar1 & 0x1e;
        }
        (result->fUnion).fStackFields.fLengthAndFlags = uVar9;
        if (pTVar7 == (TimeZoneNames *)0x0) {
          return result;
        }
      }
      (*(pTVar7->super_UObject)._vptr_UObject[1])();
      local_88._0_4_ = UVar2;
      goto joined_r0x001f8bfc;
    }
    pTVar6 = TimeZoneFormat::createInstance(locale,&status);
    local_88 = (TimeZoneNames *)CONCAT44(local_88._4_4_,status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((daylight == '\0') ||
         (iVar3 = (*(this->super_UObject)._vptr_UObject[9])(this), (char)iVar3 == '\0')) {
        iVar5 = (*(this->super_UObject)._vptr_UObject[8])(this);
      }
      else {
        iVar3 = (*(this->super_UObject)._vptr_UObject[8])(this);
        iVar4 = (*(this->super_UObject)._vptr_UObject[0xd])();
        iVar5 = iVar4 + iVar3;
      }
      if (style == LONG_GMT) {
        TimeZoneFormat::formatOffsetLocalizedGMT(pTVar6,iVar5,result,&status);
      }
      else {
        TimeZoneFormat::formatOffsetISO8601Basic(pTVar6,iVar5,'\0','\0','\0',result,&status);
      }
    }
    else {
      uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
      uVar9 = 2;
      if ((uVar1 & 1) == 0) {
        uVar9 = uVar1 & 0x1e;
      }
      (result->fUnion).fStackFields.fLengthAndFlags = uVar9;
    }
  }
LAB_001f88c7:
  if (pTVar6 != (TimeZoneFormat *)0x0) {
    (*(pTVar6->super_Format).super_UObject._vptr_UObject[1])(pTVar6);
  }
joined_r0x001f8bfc:
  if (((UErrorCode)local_88 < U_ILLEGAL_ARGUMENT_ERROR) && (U_ZERO_ERROR < status)) {
    uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    uVar9 = 2;
    if ((uVar1 & 1) == 0) {
      uVar9 = uVar1 & 0x1e;
    }
    (result->fUnion).fStackFields.fLengthAndFlags = uVar9;
  }
  return result;
}

Assistant:

UnicodeString&
TimeZone::getDisplayName(UBool daylight, EDisplayType style, const Locale& locale, UnicodeString& result) const
{
    UErrorCode status = U_ZERO_ERROR;
    UDate date = Calendar::getNow();
    UTimeZoneFormatTimeType timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    int32_t offset;

    if (style == GENERIC_LOCATION || style == LONG_GENERIC || style == SHORT_GENERIC) {
        LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        // Generic format
        switch (style) {
        case GENERIC_LOCATION:
            tzfmt->format(UTZFMT_STYLE_GENERIC_LOCATION, *this, date, result, &timeType);
            break;
        case LONG_GENERIC:
            tzfmt->format(UTZFMT_STYLE_GENERIC_LONG, *this, date, result, &timeType);
            break;
        case SHORT_GENERIC:
            tzfmt->format(UTZFMT_STYLE_GENERIC_SHORT, *this, date, result, &timeType);
            break;
        default:
            U_ASSERT(FALSE);
        }
        // Generic format many use Localized GMT as the final fallback.
        // When Localized GMT format is used, the result might not be
        // appropriate for the requested daylight value.
        if ((daylight && timeType == UTZFMT_TIME_TYPE_STANDARD) || (!daylight && timeType == UTZFMT_TIME_TYPE_DAYLIGHT)) {
            offset = daylight ? getRawOffset() + getDSTSavings() : getRawOffset();
            if (style == SHORT_GENERIC) {
                tzfmt->formatOffsetShortLocalizedGMT(offset, result, status);
            } else {
                tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            }
        }
    } else if (style == LONG_GMT || style == SHORT_GMT) {
        LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        offset = daylight && useDaylightTime() ? getRawOffset() + getDSTSavings() : getRawOffset();
        switch (style) {
        case LONG_GMT:
            tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            break;
        case SHORT_GMT:
            tzfmt->formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, result, status);
            break;
        default:
            U_ASSERT(FALSE);
        }

    } else {
        U_ASSERT(style == LONG || style == SHORT || style == SHORT_COMMONLY_USED);
        UTimeZoneNameType nameType = UTZNM_UNKNOWN;
        switch (style) {
        case LONG:
            nameType = daylight ? UTZNM_LONG_DAYLIGHT : UTZNM_LONG_STANDARD;
            break;
        case SHORT:
        case SHORT_COMMONLY_USED:
            nameType = daylight ? UTZNM_SHORT_DAYLIGHT : UTZNM_SHORT_STANDARD;
            break;
        default:
            U_ASSERT(FALSE);
        }
        LocalPointer<TimeZoneNames> tznames(TimeZoneNames::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        UnicodeString canonicalID(ZoneMeta::getCanonicalCLDRID(*this));
        tznames->getDisplayName(canonicalID, nameType, date, result);
        if (result.isEmpty()) {
            // Fallback to localized GMT
            LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
            offset = daylight && useDaylightTime() ? getRawOffset() + getDSTSavings() : getRawOffset();
            if (style == LONG) {
                tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            } else {
                tzfmt->formatOffsetShortLocalizedGMT(offset, result, status);
            }
        }
    }
    if (U_FAILURE(status)) {
        result.remove();
    }
    return  result;
}